

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O0

void geometrycentral::surface::writeSurfaceMesh
               (SurfaceMesh *mesh,EmbeddedGeometryInterface *geometry,ostream *out,string *type)

{
  SimplePolygonMesh *in_RCX;
  EmbeddedGeometryInterface *in_RSI;
  SurfaceMesh *in_RDI;
  SimplePolygonMesh simpleMesh;
  string local_c8 [8];
  vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
  *in_stack_ffffffffffffff40;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffff48;
  SimplePolygonMesh *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffff98;
  SimplePolygonMesh *in_stack_ffffffffffffffa0;
  
  SurfaceMesh::getFaceVertexList((SurfaceMesh *)type);
  anon_unknown_19::geometryToStdVector(in_RDI,in_RSI);
  SimplePolygonMesh::SimplePolygonMesh
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
             in_stack_ffffffffffffff40);
  ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::~vector
            (in_stack_ffffffffffffff40);
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_ffffffffffffff40);
  ::std::__cxx11::string::string(local_c8,(string *)in_RCX);
  SimplePolygonMesh::writeMesh
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ::std::__cxx11::string::~string(local_c8);
  SimplePolygonMesh::~SimplePolygonMesh(in_RCX);
  return;
}

Assistant:

void writeSurfaceMesh(SurfaceMesh& mesh, EmbeddedGeometryInterface& geometry, std::ostream& out, std::string type) {
  SimplePolygonMesh simpleMesh(mesh.getFaceVertexList(), geometryToStdVector(mesh, geometry));
  simpleMesh.writeMesh(out, type);
}